

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::writeExtraTargets(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  ProString *pPVar2;
  char (*pacVar3) [8];
  ProString *pPVar4;
  char (*pacVar5) [8];
  ProString *pPVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char (*pacVar9) [9];
  Data *pDVar10;
  char16_t *pcVar11;
  Data *pDVar12;
  ProStringList *pPVar13;
  ProStringList *pPVar14;
  QList<ProString> *vector;
  qsizetype qVar15;
  QTextStream *pQVar16;
  ProString *this_00;
  ProString *pPVar17;
  long in_FS_OFFSET;
  QLatin1String QVar18;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_108;
  undefined8 local_f8;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_e8;
  char (*local_d8) [8];
  QString local_c8;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_a8;
  undefined1 *local_98;
  QString local_88;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_68,"QMAKE_EXTRA_TARGETS");
  pPVar13 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
  if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
         _M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar13->super_QList<ProString>).d.size != 0) {
    this_00 = (pPVar13->super_QList<ProString>).d.ptr;
    do {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.b = (char (*) [8])0x2a899d;
      local_a8.a = this_00;
      ProString::ProString<ProString_const&,char_const(&)[8]>(&local_68,&local_a8);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_88,this,&local_68)
      ;
      if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i = ((__atomic_base<int> *)
               &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.a = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.b = (char (*) [8])&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d.ptr = L".commands";
      local_c8.d.d = (Data *)this_00;
      ProString::ProString<ProString_const&,char_const(&)[10]>
                (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_c8);
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(&local_a8,this,&local_68)
      ;
      if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i = ((__atomic_base<int> *)
               &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_c8.d.d = (Data *)0x0;
      local_c8.d.ptr = (char16_t *)0x0;
      local_c8.d.size = 0;
      if ((char (*) [8])local_88.d.size == (char (*) [8])0x0) {
        ProString::toQString(&local_68.m_string,this_00);
        qVar15 = local_68.m_string.d.size;
        pDVar12 = local_68.m_string.d.d;
        pcVar11 = local_88.d.ptr;
        pDVar10 = local_88.d.d;
        local_68.m_string.d.d = local_88.d.d;
        pPVar17 = (ProString *)local_88.d.ptr;
        pacVar5 = (char (*) [8])local_88.d.size;
        local_88.d.d = pDVar12;
        local_88.d.ptr = local_68.m_string.d.ptr;
        pacVar3 = (char (*) [8])local_68.m_string.d.size;
        local_68.m_string.d.ptr = pcVar11;
        local_68.m_string.d.size = local_88.d.size;
        local_88.d.size = qVar15;
        if ((ProString *)pDVar10 != (ProString *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i =
               ((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i + -1;
          UNLOCK();
          if (((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar1 = this->project;
      local_e8.b = (char (*) [9])0x2a869d;
      local_e8.a = this_00;
      ProString::ProString<ProString_const&,char_const(&)[9]>(&local_68,&local_e8);
      pPVar14 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68);
      if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i = ((__atomic_base<int> *)
               &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((pPVar14->super_QList<ProString>).d.size != 0) {
        pPVar17 = (pPVar14->super_QList<ProString>).d.ptr;
        do {
          local_d8 = (char (*) [8])&DAT_aaaaaaaaaaaaaaaa;
          local_e8.a = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.b = (char (*) [9])&DAT_aaaaaaaaaaaaaaaa;
          local_108.b = (char (*) [8])0x2a899d;
          local_108.a = pPVar17;
          ProString::ProString<ProString_const&,char_const(&)[8]>(&local_68,&local_108);
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    (&local_e8,this,&local_68);
          if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i = ((__atomic_base<int> *)
                     &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)
                &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
              QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_d8 == (char (*) [8])0x0) {
            ProString::toQString(&local_68.m_string,pPVar17);
            qVar15 = local_68.m_string.d.size;
            pDVar10 = local_68.m_string.d.d;
            pacVar9 = local_e8.b;
            pPVar2 = local_e8.a;
            pPVar4 = (ProString *)local_e8.b;
            pacVar5 = local_d8;
            pPVar6 = (ProString *)local_68.m_string.d.d;
            local_e8.b = (char (*) [9])local_68.m_string.d.ptr;
            local_68.m_string.d.d = (Data *)local_e8.a;
            local_e8.a = (ProString *)pDVar10;
            pacVar3 = (char (*) [8])local_68.m_string.d.size;
            local_68.m_string.d.ptr = (char16_t *)pacVar9;
            local_68.m_string.d.size = (qsizetype)local_d8;
            local_d8 = (char (*) [8])qVar15;
            if (pPVar2 != (ProString *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(pPVar2->m_string).d.d)->_M_i =
                   ((__atomic_base<int> *)&(pPVar2->m_string).d.d)->_M_i + -1;
              UNLOCK();
              if (((__atomic_base<int> *)&(pPVar2->m_string).d.d)->_M_i == 0) {
                QArrayData::deallocate((QArrayData *)pPVar2,2,0x10);
              }
            }
          }
          (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (&local_108,this,&local_e8);
          uVar7 = local_f8;
          local_68.m_string.d.size = (qsizetype)local_108.b;
          local_68.m_string.d.ptr = (char16_t *)local_108.a;
          local_68.m_string.d.d = (Data *)0x2adf3e;
          local_108.a = (ProString *)0x0;
          local_108.b = (char (*) [8])0x0;
          local_f8._0_4_ = 0;
          local_f8._4_4_ = 0;
          uVar8 = local_f8;
          local_f8._0_4_ = (int)uVar7;
          local_f8._4_4_ = SUB84(uVar7,4);
          local_68.m_offset = (int)local_f8;
          local_68.m_length = local_f8._4_4_;
          local_f8 = uVar8;
          ::operator+=(&local_c8,(QStringBuilder<const_char_(&)[2],_QString> *)&local_68);
          if ((ProString *)local_68.m_string.d.ptr != (ProString *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_68.m_string.d.ptr)->d).d =
                 *(int *)&(((QString *)local_68.m_string.d.ptr)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_68.m_string.d.ptr)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_68.m_string.d.ptr,2,0x10);
            }
          }
          if (local_108.a != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&((local_108.a)->m_string).d.d)->_M_i =
                 ((__atomic_base<int> *)&((local_108.a)->m_string).d.d)->_M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)&((local_108.a)->m_string).d.d)->_M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_108.a,2,0x10);
            }
          }
          if (local_e8.a != (ProString *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&((local_e8.a)->m_string).d.d)->_M_i =
                 ((__atomic_base<int> *)&((local_e8.a)->m_string).d.d)->_M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)&((local_e8.a)->m_string).d.d)->_M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_e8.a,2,0x10);
            }
          }
          pPVar17 = pPVar17 + 1;
        } while (pPVar17 !=
                 (pPVar14->super_QList<ProString>).d.ptr + (pPVar14->super_QList<ProString>).d.size)
        ;
      }
      pQVar1 = this->project;
      local_e8.b = (char (*) [9])0x2a6978;
      local_e8.a = this_00;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&local_68,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_e8);
      vector = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_68)->
                super_QList<ProString>;
      if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i = ((__atomic_base<int> *)
               &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      qVar15 = QtPrivate::indexOf<ProString,char[11]>(vector,(char (*) [11])"fix_target",0);
      if (qVar15 != -1) {
        fileFixify(&local_68.m_string,this,&local_88,(FileFixifyTypes)0x1,true);
        qVar15 = local_68.m_string.d.size;
        pDVar12 = local_68.m_string.d.d;
        pcVar11 = local_88.d.ptr;
        pDVar10 = local_88.d.d;
        local_68.m_string.d.d = local_88.d.d;
        local_88.d.d = pDVar12;
        local_88.d.ptr = local_68.m_string.d.ptr;
        local_68.m_string.d.ptr = pcVar11;
        local_68.m_string.d.size = local_88.d.size;
        local_88.d.size = qVar15;
        if ((ProString *)pDVar10 != (ProString *)0x0) {
          LOCK();
          ((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i =
               ((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i + -1;
          UNLOCK();
          if (((__atomic_base<int> *)&(((QString *)&pDVar10->super_QArrayData)->d).d)->_M_i == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
      }
      qVar15 = QtPrivate::indexOf<ProString,char[6]>(vector,(char (*) [6])"phony",0);
      if (qVar15 != -1) {
        QVar18.m_data = (char *)0x6;
        QVar18.m_size = (qsizetype)&local_c8;
        QString::append(QVar18);
      }
      (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&local_68,this,&local_88);
      pQVar16 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_68);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,":");
      QTextStream::operator<<(pQVar16,(QString *)&local_c8);
      if ((ProString *)local_68.m_string.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i = ((__atomic_base<int> *)
               &(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_68.m_string.d.d)->super_QArrayData)->d).d)
            ->_M_i == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_98 != (undefined1 *)0x0) {
        pQVar16 = (QTextStream *)QTextStream::operator<<(t,"\n\t");
        QTextStream::operator<<(pQVar16,(QString *)&local_a8);
      }
      pQVar16 = (QTextStream *)Qt::endl(t);
      Qt::endl(pQVar16);
      if ((ProString *)local_c8.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_c8.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_c8.d.d)->super_QArrayData)->d).d)->_M_i +
             -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_c8.d.d)->super_QArrayData)->d).d)->_M_i ==
            0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_a8.a != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&((local_a8.a)->m_string).d.d)->_M_i =
             ((__atomic_base<int> *)&((local_a8.a)->m_string).d.d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&((local_a8.a)->m_string).d.d)->_M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.a,2,0x10);
        }
      }
      if ((ProString *)local_88.d.d != (ProString *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)&(local_88.d.d)->super_QArrayData)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)&(local_88.d.d)->super_QArrayData)->d).d)->_M_i +
             -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)&(local_88.d.d)->super_QArrayData)->d).d)->_M_i ==
            0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (pPVar13->super_QList<ProString>).d.ptr + (pPVar13->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeExtraTargets(QTextStream &t)
{
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator it = qut.begin(); it != qut.end(); ++it) {
        QString targ = var(ProKey(*it + ".target")),
                 cmd = var(ProKey(*it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*it).toQString();
        const ProStringList &deplist = project->values(ProKey(*it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += " " + escapeDependencyPath(dep);
        }
        const ProStringList &config = project->values(ProKey(*it + ".CONFIG"));
        if (config.indexOf("fix_target") != -1)
            targ = fileFixify(targ, FileFixifyFromOutdir);
        if (config.indexOf("phony") != -1)
            deps += QLatin1String(" FORCE");
        t << escapeDependencyPath(targ) << ":" << deps;
        if(!cmd.isEmpty())
            t << "\n\t" << cmd;
        t << Qt::endl << Qt::endl;
    }
}